

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

ssize_t __thiscall
kj::anon_unknown_77::AsyncPipe::write(AsyncPipe *this,int __fd,void *__buf,size_t __n)

{
  size_t sVar1;
  AsyncIoStream *pAVar2;
  uchar *puVar3;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> morePieces;
  _func_int **pp_Var4;
  undefined4 in_register_00000034;
  ArrayPtr<const_unsigned_char> writeBuffer;
  ArrayPtr<const_unsigned_char> *local_38;
  _func_int **pp_Stack_30;
  
  if (__n != 0) {
    do {
      sVar1 = *(size_t *)((long)__buf + 8);
      if (sVar1 != 0) {
        pAVar2 = (((AsyncPipe *)CONCAT44(in_register_00000034,__fd))->state).ptr;
        if (pAVar2 != (AsyncIoStream *)0x0) {
          (*(pAVar2->super_AsyncOutputStream)._vptr_AsyncOutputStream[1])
                    (this,&pAVar2->super_AsyncOutputStream);
          return (ssize_t)this;
        }
        local_38 = (ArrayPtr<const_unsigned_char> *)((long)__buf + 0x10);
        pp_Stack_30 = (_func_int **)(__n - 1);
        puVar3 = *__buf;
        pp_Var4 = (_func_int **)operator_new(0x1d0);
        pp_Var4[1] = (_func_int *)0x0;
        *pp_Var4 = (_func_int *)&PTR_onReady_0044abd8;
        pp_Var4[2] = (_func_int *)&PTR_fulfill_0044ac20;
        *(undefined1 *)(pp_Var4 + 3) = 0;
        *(undefined1 *)(pp_Var4 + 0x2f) = 0;
        *(undefined1 *)(pp_Var4 + 0x30) = 1;
        morePieces.size_ = (size_t)pp_Stack_30;
        morePieces.ptr = local_38;
        writeBuffer.size_ = sVar1;
        writeBuffer.ptr = puVar3;
        BlockedWrite::BlockedWrite
                  ((BlockedWrite *)(pp_Var4 + 0x31),(PromiseFulfiller<void> *)(pp_Var4 + 2),
                   (AsyncPipe *)CONCAT44(in_register_00000034,__fd),writeBuffer,morePieces);
        (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
             (_func_int **)
             &_::
              HeapDisposer<kj::_::AdapterPromiseNode<kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite>>
              ::instance;
        (this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream = pp_Var4;
        return (ssize_t)this;
      }
      __buf = (void *)((long)__buf + 0x10);
      __n = __n - 1;
    } while (__n != 0);
  }
  heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_38);
  (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)local_38
  ;
  (this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream = pp_Stack_30;
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    while (pieces.size() > 0 && pieces[0].size() == 0) {
      pieces = pieces.slice(1, pieces.size());
    }

    if (pieces.size() == 0) {
      return kj::READY_NOW;
    } else KJ_IF_MAYBE(s, state) {
      return s->write(pieces);
    } else {
      return newAdaptedPromise<void, BlockedWrite>(
          *this, pieces[0], pieces.slice(1, pieces.size()));
    }
  }